

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O0

Iterator __thiscall
axl::sl::
ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
::insertTail(ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
             *this,HashTableEntry<unsigned_long,_bool> *p)

{
  Link *this_00;
  HashTableEntry<unsigned_long,_bool> *in_RSI;
  HashTableEntry<unsigned_long,_bool> *in_RDI;
  ListLink *tailLink;
  ListLink *link;
  Entry *in_stack_ffffffffffffffd0;
  ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink> local_21;
  ListLink *local_20;
  HashTableEntry<unsigned_long,_bool> *local_18;
  IteratorImpl<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
  local_8;
  
  local_18 = in_RSI;
  local_20 = ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>::
             operator()(&local_21,in_RSI);
  this_00 = IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
            ::getLinkFromEntry(in_stack_ffffffffffffffd0);
  local_20->m_next = (ListLink *)0x0;
  local_20->m_prev = this_00;
  if (this_00 == (Link *)0x0) {
    (in_RDI->super_MapEntry<unsigned_long,_bool>).super_ListLink.m_next = (ListLink *)local_18;
  }
  else {
    this_00->m_next = local_20;
  }
  (in_RDI->super_MapEntry<unsigned_long,_bool>).super_ListLink.m_prev = (ListLink *)local_18;
  (in_RDI->super_MapEntry<unsigned_long,_bool>).m_key =
       (in_RDI->super_MapEntry<unsigned_long,_bool>).m_key + 1;
  Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
  ::Iterator((Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
              *)this_00,in_RDI);
  return (Iterator)
         local_8.
         super_IteratorBase<axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>
         .m_p;
}

Assistant:

Iterator
	insertTail(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* tailLink = Iterator::getLinkFromEntry(this->m_tail);

		link->m_next = NULL;
		link->m_prev = tailLink;

		if (tailLink)
			tailLink->m_next = link;
		else
			this->m_head = p;

		this->m_tail = p;
		this->m_count++;

		return p;
	}